

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsCreators.cpp
# Opt level: O2

bool chrono::utils::LoadConvexMesh
               (string *file_name,ChTriangleMeshConnected *convex_mesh,
               ChConvexDecompositionHACDv2 *convex_shape,ChVector<double> *pos,
               ChQuaternion<double> *rot,int hacd_maxhullcount,int hacd_maxhullmerge,
               int hacd_maxhullvertexes,float hacd_concavity,float hacd_smallclusterthreshold,
               float hacd_fusetolerance)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  pointer pCVar5;
  long lVar6;
  ulong uVar7;
  double local_48;
  double dStack_40;
  double local_38;
  
  bVar4 = geometry::ChTriangleMeshConnected::LoadWavefrontMesh(convex_mesh,file_name,true,false);
  if (bVar4) {
    pCVar5 = (convex_mesh->m_vertices).
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar6 = 0;
    for (uVar7 = 0;
        uVar7 < (ulong)(((long)(convex_mesh->m_vertices).
                               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar5) / 0x18);
        uVar7 = uVar7 + 1) {
      ChQuaternion<double>::Rotate(rot,(ChVector<double> *)((long)pCVar5->m_data + lVar6));
      dVar2 = pos->m_data[2];
      dVar3 = pos->m_data[1];
      pCVar5 = (convex_mesh->m_vertices).
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar1 = (double *)((long)pCVar5->m_data + lVar6);
      *pdVar1 = pos->m_data[0] + local_48;
      pdVar1[1] = dVar3 + dStack_40;
      *(double *)((long)pCVar5->m_data + lVar6 + 0x10) = dVar2 + local_38;
      lVar6 = lVar6 + 0x18;
    }
    (*(convex_shape->super_ChConvexDecomposition)._vptr_ChConvexDecomposition[2])(convex_shape);
    (*(convex_shape->super_ChConvexDecomposition)._vptr_ChConvexDecomposition[5])
              (convex_shape,convex_mesh);
    collision::ChConvexDecompositionHACDv2::SetParameters
              (convex_shape,hacd_maxhullcount,hacd_maxhullmerge,hacd_maxhullvertexes,hacd_concavity,
               hacd_smallclusterthreshold,hacd_fusetolerance);
    (*(convex_shape->super_ChConvexDecomposition)._vptr_ChConvexDecomposition[6])(convex_shape);
  }
  return bVar4;
}

Assistant:

bool LoadConvexMesh(const std::string& file_name,
                    ChTriangleMeshConnected& convex_mesh,
                    ChConvexDecompositionHACDv2& convex_shape,
                    const ChVector<>& pos,
                    const ChQuaternion<>& rot,
                    int hacd_maxhullcount,
                    int hacd_maxhullmerge,
                    int hacd_maxhullvertexes,
                    float hacd_concavity,
                    float hacd_smallclusterthreshold,
                    float hacd_fusetolerance) {
    if (!convex_mesh.LoadWavefrontMesh(file_name, true, false))
        return false;

    for (int i = 0; i < convex_mesh.m_vertices.size(); i++) {
        convex_mesh.m_vertices[i] = pos + rot.Rotate(convex_mesh.m_vertices[i]);
    }

    convex_shape.Reset();
    convex_shape.AddTriangleMesh(convex_mesh);
    convex_shape.SetParameters(hacd_maxhullcount, hacd_maxhullmerge, hacd_maxhullvertexes, hacd_concavity,
                               hacd_smallclusterthreshold, hacd_fusetolerance);
    convex_shape.ComputeConvexDecomposition();

    return true;
}